

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::report_system_error(int error_code,string_view message)

{
  int in_stack_0000022c;
  FormatFunc in_stack_00000230;
  string_view in_stack_00000238;
  
  anon_unknown_1::report_error(in_stack_00000230,in_stack_0000022c,in_stack_00000238);
  return;
}

Assistant:

FMT_FUNC void report_system_error(
    int error_code, fmt::string_view message) FMT_NOEXCEPT {
  report_error(format_system_error, error_code, message);
}